

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O1

uint32_t mpack_node_data_len(mpack_node_t node)

{
  uint32_t uVar1;
  mpack_tree_t *pmVar2;
  
  pmVar2 = node.tree;
  uVar1 = 0;
  if (pmVar2->error == mpack_ok) {
    if ((node.data)->type - mpack_type_str < 3) {
      uVar1 = (node.data)->len;
    }
    else {
      pmVar2->error = mpack_error_type;
      uVar1 = 0;
      if (pmVar2->error_fn != (mpack_tree_error_t)0x0) {
        (*pmVar2->error_fn)(pmVar2,mpack_error_type);
      }
    }
  }
  return uVar1;
}

Assistant:

MPACK_INLINE uint32_t mpack_node_data_len(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    mpack_type_t type = node.data->type;
    if (type == mpack_type_str || type == mpack_type_bin || type == mpack_type_ext)
        return (uint32_t)node.data->len;

    mpack_node_flag_error(node, mpack_error_type);
    return 0;
}